

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptSymbol * __thiscall
Js::JavascriptLibrary::CreateSymbol
          (JavascriptLibrary *this,char16 *description,int descriptionLength)

{
  ScriptContext *this_00;
  ThreadContext *this_01;
  JavascriptSymbol *pJVar1;
  PropertyRecord *local_28;
  PropertyRecord *propertyRecord;
  char16 *pcStack_18;
  int descriptionLength_local;
  char16 *description_local;
  JavascriptLibrary *this_local;
  
  propertyRecord._4_4_ = descriptionLength;
  pcStack_18 = description;
  description_local = (char16 *)this;
  EnterPinnedScope(&local_28);
  this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  this_01 = ScriptContext::GetThreadContext(this_00);
  local_28 = ThreadContext::UncheckedAddPropertyId
                       (this_01,pcStack_18,propertyRecord._4_4_,false,true);
  LeavePinnedScope();
  pJVar1 = CreateSymbol(this,local_28);
  return pJVar1;
}

Assistant:

JavascriptSymbol* JavascriptLibrary::CreateSymbol(const char16* description, int descriptionLength)
    {
        ENTER_PINNED_SCOPE(const Js::PropertyRecord, propertyRecord);

        propertyRecord = this->scriptContext->GetThreadContext()->UncheckedAddPropertyId(description, descriptionLength, /*bind*/false, /*isSymbol*/true);

        LEAVE_PINNED_SCOPE();

        return this->CreateSymbol(propertyRecord);
    }